

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regset.c
# Opt level: O0

int make_regset(int line_no,int n,char **pat,OnigRegSet **rset,int error_no)

{
  OnigRegSet *pOVar1;
  OnigRegSet *pOVar2;
  size_t sVar3;
  undefined1 local_c8 [8];
  char s [90];
  undefined1 local_60 [8];
  OnigErrorInfo einfo;
  regex_t *reg;
  OnigRegSet *set;
  uint local_30;
  int i;
  int r;
  int error_no_local;
  OnigRegSet **rset_local;
  char **pat_local;
  uint local_10;
  int n_local;
  int line_no_local;
  
  *rset = (OnigRegSet *)0x0;
  i = error_no;
  _r = rset;
  rset_local = (OnigRegSet **)pat;
  pat_local._4_4_ = n;
  local_10 = line_no;
  n_local = onig_regset_new(&reg,0,0);
  if (n_local == 0) {
    for (set._4_4_ = 0; local_30 = 0, set._4_4_ < pat_local._4_4_; set._4_4_ = set._4_4_ + 1) {
      pOVar1 = rset_local[set._4_4_];
      pOVar2 = rset_local[set._4_4_];
      sVar3 = strlen((char *)rset_local[set._4_4_]);
      local_30 = onig_new(&einfo.par_end,pOVar1,pOVar2 + sVar3,0,&OnigEncodingUTF8,
                          _OnigDefaultSyntax,local_60);
      if (local_30 != 0) {
        if (i == 0) {
          onig_error_code_to_str(local_c8,local_30,local_60);
          fprintf(_stderr,"ERROR: %d: %s  /%s/\n",(ulong)local_10,local_c8,rset_local[set._4_4_]);
          nerror = nerror + 1;
        }
        else if (local_30 == i) {
          fprintf(_stdout,"OK(ERROR): %d: /%s/ %d\n",(ulong)local_10,rset_local[set._4_4_],
                  (ulong)local_30);
          nsucc = nsucc + 1;
        }
        else {
          fprintf(_stdout,"FAIL(ERROR): %d: /%s/ %d, %d\n",(ulong)local_10,rset_local[set._4_4_],
                  (ulong)(uint)i,(ulong)local_30);
          nfail = nfail + 1;
        }
        onig_regset_free(reg);
        return local_30;
      }
      local_30 = onig_regset_add(reg,einfo.par_end);
      if (local_30 != 0) {
        onig_regset_free(reg);
        fprintf(_stderr,"ERROR: %d: onig_regset_add(): /%s/\n",(ulong)local_10,rset_local[set._4_4_]
               );
        nerror = nerror + 1;
        return local_30;
      }
    }
    *_r = (OnigRegSet *)reg;
    n_local = 0;
  }
  return n_local;
}

Assistant:

static int
make_regset(int line_no, int n, char* pat[], OnigRegSet** rset, int error_no)
{
  int r;
  int i;
  OnigRegSet* set;
  regex_t* reg;
  OnigErrorInfo einfo;

  *rset = NULL;
  r = onig_regset_new(&set, 0, NULL);
  if (r != 0) return r;

  for (i = 0; i < n; i++) {
    r = onig_new(&reg, (UChar* )pat[i], (UChar* )(pat[i] + strlen(pat[i])),
                 ONIG_OPTION_DEFAULT, ONIG_ENCODING_UTF8, ONIG_SYNTAX_DEFAULT,
                 &einfo);
    if (r != 0) {
      char s[ONIG_MAX_ERROR_MESSAGE_LEN];

      if (error_no == 0) {
        onig_error_code_to_str((UChar* )s, r, &einfo);
        fprintf(stderr, "ERROR: %d: %s  /%s/\n", line_no, s, pat[i]);
        nerror++;
      }
      else {
        if (r == error_no) {
          fprintf(stdout, "OK(ERROR): %d: /%s/ %d\n", line_no, pat[i], r);
          nsucc++;
        }
        else {
          fprintf(stdout, "FAIL(ERROR): %d: /%s/ %d, %d\n",
                  line_no, pat[i], error_no, r);
          nfail++;
        }
      }
      onig_regset_free(set);
      return r;
    }

    r = onig_regset_add(set, reg);
    if (r != 0) {
      onig_regset_free(set);
      fprintf(stderr, "ERROR: %d: onig_regset_add(): /%s/\n", line_no, pat[i]);
      nerror++;
      return r;
    }
  }

  *rset = set;
  return 0;
}